

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cmMakefile::DeferGetCallIds_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmMakefile *this)

{
  bool bVar1;
  pointer range;
  cmRange<__gnu_cxx::__normal_iterator<const_cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>_>
  local_c0;
  undefined1 local_b0 [48];
  cmRange<RangeIterators::TransformIterator<RangeIterators::FilterIterator<__gnu_cxx::__normal_iterator<const_cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmMakefile_cxx:3048:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmMakefile_cxx:3050:11)>_>
  local_80;
  string local_40;
  undefined1 local_19;
  cmMakefile *local_18;
  cmMakefile *this_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *ids;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmMakefile *)__return_storage_ptr__;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(__return_storage_ptr__);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->Defer);
  if (bVar1) {
    range = std::
            unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
            operator->(&this->Defer);
    local_c0 = cmMakeRange<std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>
                         (&range->Commands);
    cmRange<__gnu_cxx::__normal_iterator<cmMakefile::DeferCommand_const*,std::vector<cmMakefile::DeferCommand,std::allocator<cmMakefile::DeferCommand>>>>
    ::filter<cmMakefile::DeferGetCallIds[abi:cxx11]()const::__0>(local_b0,&local_c0);
    cmRange<RangeIterators::FilterIterator<__gnu_cxx::__normal_iterator<cmMakefile::DeferCommand_const*,std::vector<cmMakefile::DeferCommand,std::allocator<cmMakefile::DeferCommand>>>,cmMakefile::DeferGetCallIds[abi:cxx11]()const::$_0>>
    ::transform<cmMakefile::DeferGetCallIds[abi:cxx11]()const::__1>(&local_80,local_b0);
    cmList::
    to_string<cmRange<RangeIterators::TransformIterator<RangeIterators::FilterIterator<__gnu_cxx::__normal_iterator<const_cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmMakefile_cxx:3048:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmMakefile_cxx:3050:11)>_>,_0>
              (&local_40,&local_80);
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::string> cmMakefile::DeferGetCallIds() const
{
  cm::optional<std::string> ids;
  if (this->Defer) {
    ids = cmList::to_string(
      cmMakeRange(this->Defer->Commands)
        .filter([](DeferCommand const& dc) -> bool { return !dc.Id.empty(); })
        .transform(
          [](DeferCommand const& dc) -> std::string const& { return dc.Id; }));
  }
  return ids;
}